

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_context.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::context::apply_patches(context *this,transaction_base *t)

{
  bool bVar1;
  reference this_00;
  type ppVar2;
  undefined8 extraout_RDX;
  error_code eVar3;
  unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>
  *patch;
  iterator __end3;
  iterator __begin3;
  list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  *__range3;
  transaction_base *t_local;
  context *this_local;
  error_code erc;
  
  __end3 = std::__cxx11::
           list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
           ::begin(&this->patches);
  patch = (unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>
           *)std::__cxx11::
             list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
             ::end(&this->patches);
  while (bVar1 = std::operator!=(&__end3,(_Self *)&patch), bVar1) {
    this_00 = std::
              _List_iterator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>
              ::operator*(&__end3);
    ppVar2 = std::
             unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>
             ::operator*(this_00);
    this_local._0_4_ = (*ppVar2->_vptr_patcher[2])(ppVar2,t);
    erc._0_8_ = extraout_RDX;
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&this_local);
    if (bVar1) goto LAB_001306db;
    std::
    _List_iterator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>
    ::operator++(&__end3);
  }
  std::__cxx11::
  list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  ::clear(&this->patches);
  std::error_code::error_code((error_code *)&this_local);
LAB_001306db:
  eVar3._4_4_ = 0;
  eVar3._M_value = (uint)this_local;
  eVar3._M_cat = (error_category *)erc._0_8_;
  return eVar3;
}

Assistant:

std::error_code apply_patches (transaction_base * const t) {
                    for (auto const & patch : patches) {
                        if (std::error_code const erc = (*patch) (t)) {
                            return erc;
                        }
                    }
                    // Ensure that we can't apply the patches more than once.
                    patches.clear ();
                    return {};
                }